

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *pFVar1;
  Precision PVar2;
  Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> *this_00;
  size_t sVar3;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  bool bVar6;
  int iVar7;
  MessageBuilder *this_01;
  undefined8 uVar8;
  IVal *pIVar9;
  long lVar10;
  TestStatus *__return_storage_ptr___00;
  ulong size;
  string *this_02;
  IVal reference1;
  int numErrors;
  FuncSet funcs;
  IVal in3;
  FloatFormat highpFmt;
  Environment env;
  void *outputArr [2];
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> inputs;
  EvalContext ctx;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffab8;
  IVal local_541;
  TestLog *local_540;
  uint local_534;
  undefined1 local_530 [8];
  undefined8 local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_520;
  _Rb_tree_node_base *local_510;
  size_t local_508;
  ulong local_500;
  ulong local_4f8;
  TestStatus *local_4f0;
  string local_4e8;
  TestLog *local_4c8;
  double dStack_4c0;
  double dStack_4b8;
  FloatFormat *local_4a8;
  ulong local_4a0;
  FloatFormat local_498;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  pointer local_438;
  pointer local_430;
  pointer local_428;
  pointer local_420;
  pointer local_418;
  pointer local_410;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_408;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> local_3d8;
  undefined1 local_378 [8];
  double dStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_368;
  double local_358;
  Precision local_350;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_348;
  undefined4 local_340;
  ResultCollector local_1f8;
  string local_1a8 [11];
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar2 = (this->m_caseCtx).precision;
  sVar3 = (this->m_caseCtx).numRandoms;
  local_4f0 = __return_storage_ptr__;
  iVar7 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>
            (&local_3d8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar2,(Precision)sVar3,(ulong)(iVar7 + 0xdeadbeef),
             in_stack_fffffffffffffab8);
  size = (long)local_3d8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_3d8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start >> 2;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_408,size);
  local_498.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_498.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_498.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_498.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_498.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_498.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_498.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_498.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_498._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_534 = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_540 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_428 = local_3d8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_420 = local_3d8.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_418 = local_3d8.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_410 = local_3d8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_438 = local_408.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_430 = local_408.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_378 = (undefined1  [8])local_540;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_370);
  std::operator<<((ostream *)&dStack_370,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_378,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_370);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_528 = (double)((ulong)local_528._4_4_ << 0x20);
  aStack_520._M_allocated_capacity = 0;
  local_508 = 0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_520._8_8_ = (_Rb_tree_node_base *)&local_528;
  local_510 = (_Rb_tree_node_base *)&local_528;
  (*pSVar4->_vptr_Statement[4])(pSVar4,local_530);
  for (uVar8 = aStack_520._8_8_; (_Rb_tree_node_base *)uVar8 != (_Rb_tree_node_base *)&local_528;
      uVar8 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar8)) {
    (**(code **)(**(long **)(uVar8 + 0x20) + 0x30))(*(long **)(uVar8 + 0x20),local_1a8);
  }
  if (local_508 != 0) {
    local_378 = (undefined1  [8])local_540;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_370);
    std::operator<<((ostream *)&dStack_370,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&dStack_370,(string *)&local_4e8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_370);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,size & 0xffffffff,&local_428,&local_438,0);
  local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffffffffff00);
  dStack_370 = INFINITY;
  aStack_368._M_allocated_capacity = 0xfff0000000000000;
  local_1a8[0]._M_dataplus._M_p._0_1_ = 0;
  local_1a8[0]._M_string_length = 0x7ff0000000000000;
  local_1a8[0].field_2._M_allocated_capacity = 0xfff0000000000000;
  local_530[0] = (string)0x0;
  local_528 = INFINITY;
  aStack_520._M_allocated_capacity = 0xfff0000000000000;
  local_4e8._M_dataplus._M_p._0_1_ = 0;
  local_4e8._M_string_length = 0x7ff0000000000000;
  local_4e8.field_2._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_468,
             (this->m_variables).in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_378);
  Environment::bind<float>
            ((Environment *)&local_468,
             (this->m_variables).in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_1a8);
  Environment::bind<float>
            ((Environment *)&local_468,
             (this->m_variables).in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_530);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<float>
            ((Environment *)&local_468,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&local_4e8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_541);
  lVar10 = 0;
  local_500 = 0;
  local_4f8 = size;
  local_4a8 = pFVar1;
  while( true ) {
    pFVar1 = local_4a8;
    if (size == 0) break;
    local_4c8 = (TestLog *)((ulong)local_4c8 & 0xffffffffffffff00);
    dStack_4c0 = INFINITY;
    dStack_4b8 = -INFINITY;
    round<float>((IVal *)local_1a8,local_4a8,
                 (float *)((long)local_3d8.in0.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar10));
    tcu::FloatFormat::convert((Interval *)local_378,pFVar1,(Interval *)local_1a8);
    pIVar9 = Environment::lookup<float>
                       ((Environment *)&local_468,
                        (this->m_variables).in0.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    pIVar9->m_hi = (double)aStack_368._M_allocated_capacity;
    pIVar9->m_hasNaN = local_378;
    pIVar9->m_lo = dStack_370;
    round<float>((IVal *)local_1a8,pFVar1,
                 (float *)((long)local_3d8.in1.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar10));
    tcu::FloatFormat::convert((Interval *)local_378,pFVar1,(Interval *)local_1a8);
    pIVar9 = Environment::lookup<float>
                       ((Environment *)&local_468,
                        (this->m_variables).in1.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    pIVar9->m_hi = (double)aStack_368._M_allocated_capacity;
    pIVar9->m_hasNaN = local_378;
    pIVar9->m_lo = dStack_370;
    round<float>((IVal *)local_1a8,pFVar1,
                 (float *)((long)local_3d8.in2.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar10));
    tcu::FloatFormat::convert((Interval *)local_378,pFVar1,(Interval *)local_1a8);
    pIVar9 = Environment::lookup<float>
                       ((Environment *)&local_468,
                        (this->m_variables).in2.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    pIVar9->m_hi = (double)aStack_368._M_allocated_capacity;
    pIVar9->m_hasNaN = local_378;
    pIVar9->m_lo = dStack_370;
    local_4a0 = size - 1;
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_468,
               (this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    local_350 = (this->m_caseCtx).precision;
    local_358 = pFVar1->m_maxValue;
    local_378 = *(undefined1 (*) [8])pFVar1;
    dStack_370 = *(double *)&pFVar1->m_fractionBits;
    aStack_368._M_allocated_capacity = *(undefined8 *)&pFVar1->m_hasInf;
    aStack_368._8_1_ = pFVar1->m_exactPrecision;
    aStack_368._9_3_ = *(undefined3 *)&pFVar1->field_0x19;
    aStack_368._12_4_ = *(undefined4 *)&pFVar1->field_0x1c;
    local_340 = 0;
    pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_348 = &local_468;
    (*pSVar4->_vptr_Statement[3])(pSVar4,local_378);
    pIVar9 = Environment::lookup<float>
                       ((Environment *)&local_468,
                        (this->m_variables).out0.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    tcu::FloatFormat::convert((Interval *)local_378,&local_498,pIVar9);
    dStack_4b8 = (double)aStack_368._M_allocated_capacity;
    local_4c8 = (TestLog *)local_378;
    dStack_4c0 = dStack_370;
    bVar6 = contains<float>((IVal *)&local_4c8,
                            (float *)((long)local_408.out0.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar10));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_1a8);
    bVar6 = tcu::ResultCollector::check(&local_1f8,bVar6,(string *)local_378);
    std::__cxx11::string::~string((string *)local_378);
    if (!bVar6) {
      local_534 = (int)local_500 + 1;
      local_500 = (ulong)local_534;
      if ((int)local_534 < 0x65) {
        local_378 = (undefined1  [8])local_540;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_370);
        std::operator<<((ostream *)&dStack_370,"Failed");
        std::operator<<((ostream *)&dStack_370," sample:\n");
        std::operator<<((ostream *)&dStack_370,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)&dStack_370,(string *)local_1a8);
        std::operator<<((ostream *)&dStack_370," = ");
        valueToString<float>
                  ((string *)local_530,&local_498,
                   (float *)((long)local_3d8.in0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10));
        std::operator<<((ostream *)&dStack_370,(string *)local_530);
        std::operator<<((ostream *)&dStack_370,"\n");
        std::__cxx11::string::~string((string *)local_530);
        std::__cxx11::string::~string((string *)local_1a8);
        std::operator<<((ostream *)&dStack_370,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((this->m_variables).in1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)&dStack_370,(string *)local_1a8);
        std::operator<<((ostream *)&dStack_370," = ");
        valueToString<float>
                  ((string *)local_530,&local_498,
                   (float *)((long)local_3d8.in1.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10));
        std::operator<<((ostream *)&dStack_370,(string *)local_530);
        std::operator<<((ostream *)&dStack_370,"\n");
        std::__cxx11::string::~string((string *)local_530);
        std::__cxx11::string::~string((string *)local_1a8);
        std::operator<<((ostream *)&dStack_370,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((this->m_variables).in2.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)&dStack_370,(string *)local_1a8);
        std::operator<<((ostream *)&dStack_370," = ");
        valueToString<float>
                  ((string *)local_530,&local_498,
                   (float *)((long)local_3d8.in2.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10));
        std::operator<<((ostream *)&dStack_370,(string *)local_530);
        std::operator<<((ostream *)&dStack_370,"\n");
        std::__cxx11::string::~string((string *)local_530);
        std::__cxx11::string::~string((string *)local_1a8);
        std::operator<<((ostream *)&dStack_370,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)&dStack_370,(string *)local_1a8);
        std::operator<<((ostream *)&dStack_370," = ");
        valueToString<float>
                  ((string *)local_530,&local_498,
                   (float *)((long)local_408.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10));
        std::operator<<((ostream *)&dStack_370,(string *)local_530);
        std::operator<<((ostream *)&dStack_370,"\n");
        std::operator<<((ostream *)&dStack_370,"\tExpected range: ");
        intervalToString<float>(&local_4e8,&local_498,(IVal *)&local_4c8);
        std::operator<<((ostream *)&dStack_370,(string *)&local_4e8);
        std::operator<<((ostream *)&dStack_370,"\n");
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)local_530);
        std::__cxx11::string::~string((string *)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_370);
      }
    }
    lVar10 = lVar10 + 4;
    size = local_4a0;
  }
  iVar7 = (int)local_500;
  if (iVar7 < 0x65) {
    if (iVar7 == 0) {
      local_378 = (undefined1  [8])local_540;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_370);
      std::operator<<((ostream *)&dStack_370,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)&dStack_370);
      std::operator<<((ostream *)&dStack_370," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_370);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_378,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_4f0;
      tcu::TestStatus::pass(local_4f0,(string *)local_378);
      this_02 = (string *)local_378;
      goto LAB_007e5bb3;
    }
  }
  else {
    local_378 = (undefined1  [8])local_540;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_370);
    std::operator<<((ostream *)&dStack_370,"(Skipped ");
    std::ostream::operator<<((ostringstream *)&dStack_370,iVar7 + -100);
    std::operator<<((ostream *)&dStack_370," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_370);
  }
  local_378 = (undefined1  [8])local_540;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_370);
  std::ostream::operator<<((ostringstream *)&dStack_370,iVar7);
  std::operator<<((ostream *)&dStack_370,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)&dStack_370);
  std::operator<<((ostream *)&dStack_370," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_370);
  de::toString<int>(local_1a8,(int *)&local_534);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530," test failed. Check log for the details",
             (allocator<char> *)&local_4e8);
  __return_storage_ptr___00 = local_4f0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_378);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_530);
  this_02 = local_1a8;
LAB_007e5bb3:
  std::__cxx11::string::~string((string *)this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::~Outputs(&local_408);
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>::~Inputs
            (&local_3d8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}